

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  FILE *__stream;
  void *__buf_00;
  undefined4 in_register_00000034;
  char local_438 [8];
  char _error_msg__3 [256];
  char _error_msg__2 [256];
  FILE *fin;
  char _error_msg__1 [256];
  char local_118 [8];
  char _error_msg_ [256];
  char *fname_local;
  Arcflow *this_local;
  
  _error_msg_._248_8_ = CONCAT44(in_register_00000034,__fd);
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x26c);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_118);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = check_ext((char *)_error_msg_._248_8_,".afg");
  if (!bVar1) {
    snprintf((char *)&fin,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "check_ext(fname, \".afg\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x26d);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,(char *)&fin);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __stream = fopen((char *)_error_msg_._248_8_,"r");
  if (__stream == (FILE *)0x0) {
    perror("fopen");
    snprintf(_error_msg__3 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fin != NULL",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x272);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__3 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  read(this,(int)__stream,__buf_00,__nbytes);
  fclose(__stream);
  bVar2 = this->ready & 1;
  if (bVar2 == 1) {
    return (ulong)bVar2;
  }
  snprintf(local_438,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","ready == true"
           ,
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x275);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,local_438);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::read(const char *fname) {
	throw_assert(ready == false);
	throw_assert(check_ext(fname, ".afg"));
	FILE *fin = fopen(fname, "r");
	if (fin == NULL) {
		perror("fopen");
	}
	throw_assert(fin != NULL);
	read(fin);
	fclose(fin);
	throw_assert(ready == true);
}